

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererParallelTests::SingleThreadedRenderingIsDoneInSingleThread
          (RendererParallelTests *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long lVar4;
  thread_mapping mapping;
  thread_mapping_blender<unsigned_short,_unsigned_char> blender;
  uint16_t reference [20];
  cell cells3 [2];
  renderer_parallel r;
  mask_full<8UL> mask;
  mutex mtx;
  scanline_cells cells [3];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_258;
  unsigned_short local_240 [4];
  void *local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  string local_220;
  void **local_200;
  mutex *local_1f8;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  string *local_1d0;
  void ***local_1c8;
  unsigned_short auStack_1c0 [16];
  undefined1 *local_1a0;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 *local_170;
  parallel local_168;
  undefined4 local_148;
  mask<8ul> local_140 [16];
  void *local_130;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  cell local_f4;
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined1 local_c4 [108];
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_58;
  undefined8 *local_48;
  cell *local_40;
  undefined8 *local_38;
  undefined8 **local_30;
  
  local_58.second = (cell *)local_c4;
  local_e8._0_8_ = 0;
  local_d8 = 0;
  uStack_cc = 0;
  local_e8._8_8_ = 0x200000011;
  uStack_d4 = 0xfffffffd;
  uStack_d0 = 4;
  local_c8 = 0xfffffff2;
  local_40 = &local_f4;
  local_108 = 0;
  uStack_fc = 0;
  local_118 = 1;
  uStack_110 = 0x2000000ab;
  uStack_104 = 0xffffffe2;
  uStack_100 = 5;
  local_f8 = 0xffffff73;
  local_30 = &local_170;
  local_188 = 1;
  uStack_180 = 0x9000000a0;
  local_178 = 0xffffff6000000000;
  local_58.first = (cell *)local_e8;
  local_48 = &local_118;
  local_38 = &local_188;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            (local_140,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [3])
             &local_58,1);
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x28);
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start + 0x14;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[8] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[3] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[5] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[6] = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[7] = 0;
  local_240[0] = 5;
  local_240[1] = 0;
  local_240[2] = 4;
  local_240[3] = 0;
  local_228 = 0;
  local_238 = (void *)0x0;
  uStack_230 = 0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  mutex::mutex((mutex *)(local_c4 + 8));
  local_200 = &local_238;
  local_1f8 = (mutex *)(local_c4 + 8);
  puVar3 = (undefined8 *)operator_new__(0x18);
  *puVar3 = 1;
  local_170 = puVar3 + 1;
  puVar3[1] = 0;
  *(undefined4 *)(puVar3 + 2) = 0;
  parallel::parallel(&local_168,1);
  local_1e0._M_allocated_capacity = (size_type)&local_170;
  local_148 = 1;
  local_1c8 = &local_200;
  local_1f0._8_8_ = &local_1c8;
  auStack_1c0[0] = 0;
  auStack_1c0[1] = 0;
  auStack_1c0[2] = 0;
  auStack_1c0[3] = 0;
  auStack_1c0[4] = 0;
  auStack_1c0[5] = 0;
  auStack_1c0[6] = 0;
  auStack_1c0[7] = 0;
  auStack_1c0[8] = local_240[0];
  auStack_1c0[9] = local_240[1];
  auStack_1c0[10] = local_240[2];
  auStack_1c0[0xb] = local_240[3];
  local_1f0._0_8_ = &PTR_operator___001c2ea8;
  local_1d0 = &local_220;
  local_1e0._8_8_ = local_140;
  local_1a0 = (undefined1 *)&local_258;
  parallel::call(&local_168,(kernel_function *)local_1f0);
  auStack_1c0[4] = 0xe;
  auStack_1c0[5] = 0;
  auStack_1c0[6] = 0;
  auStack_1c0[7] = 0xab;
  auStack_1c0[8] = 0x8d;
  auStack_1c0[9] = 0x8d;
  auStack_1c0[10] = 0x8d;
  auStack_1c0[0xb] = 0;
  local_1c8 = (void ***)0x0;
  auStack_1c0[0] = 0;
  auStack_1c0[1] = 0x11;
  auStack_1c0[2] = 0x11;
  auStack_1c0[3] = 0xe;
  auStack_1c0[0xc] = 0xa0;
  auStack_1c0[0xd] = 0xa0;
  auStack_1c0[0xe] = 0xa0;
  auStack_1c0[0xf] = 0xa0;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1f0,&local_220,0x77);
  ut::are_equal<unsigned_short,20ul,std::vector<unsigned_short,std::allocator<unsigned_short>>>
            ((unsigned_short (*) [20])&local_1c8,&local_258,(LocationInfo *)local_1f0);
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  puVar3 = local_170;
  if (local_170 != (undefined8 *)0x0) {
    puVar1 = local_170 + -1;
    if (local_170[-1] != 0) {
      lVar4 = local_170[-1] << 4;
      do {
        pvVar2 = *(void **)((long)puVar3 + lVar4 + -0x10);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
        lVar4 = lVar4 + -0x10;
      } while (lVar4 != 0);
    }
    operator_delete__(puVar1);
  }
  parallel::~parallel(&local_168);
  mutex::~mutex((mutex *)(local_c4 + 8));
  if (local_238 != (void *)0x0) {
    operator_delete(local_238);
  }
  if (local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130 != (void *)0x0) {
    operator_delete(local_130);
  }
  return;
}

Assistant:

test( SingleThreadedRenderingIsDoneInSingleThread )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 2, 0, -0x03 }, { 4, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 1, 0, 0xAB }, { 2, 0, -0x1E }, { 5, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
				};
				mocks::mask_full<8> mask(cells, 1);
				mocks::bitmap<uint16_t> bitmap(5, 4);
				thread_mapping mapping;
				mutex mtx;
				mocks::thread_mapping_blender<uint16_t, uint8_t> blender(mapping, mtx);

				renderer_parallel r(1);

				// ACT
				r(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint16_t reference[] = {
					0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
					0x0011, 0x0011, 0x000E, 0x000E, 0x0000,
					0x0000, 0x00AB, 0x008D, 0x008D, 0x008D,
					0x0000, 0x00A0, 0x00A0, 0x00A0, 0x00A0,
				};

				assert_equal(reference, bitmap.data);
			}